

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

void Cudd_Srandom(long seed)

{
  long lVar1;
  long w;
  int i;
  long seed_local;
  
  if (seed < 0) {
    cuddRand = -seed;
  }
  else {
    cuddRand = seed;
    if (seed == 0) {
      cuddRand = 1;
    }
  }
  cuddRand2 = cuddRand;
  for (w._4_4_ = 0; w._4_4_ < 0x4b; w._4_4_ = w._4_4_ + 1) {
    lVar1 = (cuddRand % 0xd1a4) * 0x9c4e + (cuddRand / 0xd1a4) * -0x2fb3;
    cuddRand = (int)((uint)(lVar1 < 0) * 0x7fffffab) + lVar1;
    shuffleTable[w._4_4_ % 0x40] = cuddRand;
  }
  shuffleSelect = shuffleTable[1];
  return;
}

Assistant:

void
Cudd_Srandom(
  long  seed)
{
    int i;

    if (seed < 0)       cuddRand = -seed;
    else if (seed == 0) cuddRand = 1;
    else                cuddRand = seed;
    cuddRand2 = cuddRand;
    /* Load the shuffle table (after 11 warm-ups). */
    for (i = 0; i < STAB_SIZE + 11; i++) {
        long int w;
        w = cuddRand / LEQQ1;
        cuddRand = LEQA1 * (cuddRand - w * LEQQ1) - w * LEQR1;
        cuddRand += (cuddRand < 0) * MODULUS1;
        shuffleTable[i % STAB_SIZE] = cuddRand;
    }
    shuffleSelect = shuffleTable[1 % STAB_SIZE];

}